

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionRewind.cpp
# Opt level: O2

int __thiscall
Hpipe::InstructionRewind::clone
          (InstructionRewind *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  InstructionOK *pIVar1;
  Context local_90;
  
  pIVar1 = (InstructionOK *)operator_new(0x178);
  Context::Context(&local_90,(Context *)__child_stack);
  InstructionOK::Instruction(pIVar1,&local_90);
  pIVar1 = PtrPool<Hpipe::Instruction,32>::operator<<((PtrPool<Hpipe::Instruction,32> *)__fn,pIVar1)
  ;
  Context::~Context(&local_90);
  return (int)pIVar1;
}

Assistant:

Instruction *InstructionRewind::clone( PtrPool<Instruction> &inst_pool, const Context &ncx, const Vec<unsigned> &keep_ind ) {
    // return inst_pool << new InstructionRewind( ncx );
    return inst_pool << new InstructionOK( ncx );
}